

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O1

Reader capnp::DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(Reader *reader)

{
  uchar *puVar1;
  size_t sVar2;
  Reader RVar3;
  DebugComparison<const_capnp::DynamicValue::Type_&,_capnp::DynamicValue::Type> _kjCondition;
  Fault f;
  
  if (reader->type == TEXT) {
    puVar1 = (uchar *)(reader->field_1).intValue;
    sVar2 = (reader->field_1).textValue.super_StringPtr.content.size_ - 1;
  }
  else {
    _kjCondition.right = DATA;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = reader->type == DATA;
    if (_kjCondition.result) {
      puVar1 = (uchar *)(reader->field_1).intValue;
      sVar2 = (reader->field_1).textValue.super_StringPtr.content.size_;
    }
    else {
      sVar2 = 0;
      _kjCondition.left = &reader->type;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::DynamicValue::Type_const&,capnp::DynamicValue::Type>&,char_const(&)[21]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x74b,FAILED,"reader.type == DATA","_kjCondition,\"Value type mismatch.\"",
                 &_kjCondition,(char (*) [21])"Value type mismatch.");
      kj::_::Debug::Fault::~Fault(&f);
      puVar1 = (uchar *)0x0;
    }
  }
  RVar3.super_ArrayPtr<const_unsigned_char>.size_ = sVar2;
  RVar3.super_ArrayPtr<const_unsigned_char>.ptr = puVar1;
  return (Reader)RVar3.super_ArrayPtr<const_unsigned_char>;
}

Assistant:

Data::Reader DynamicValue::Reader::AsImpl<Data>::apply(const Reader& reader) {
  if (reader.type == TEXT) {
    // Coerce text to data.
    return reader.textValue.asBytes();
  }
  KJ_REQUIRE(reader.type == DATA, "Value type mismatch.") {
    return Data::Reader();
  }
  return reader.dataValue;
}